

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessFramebuffersAndRenderbuffersTests.cpp
# Opt level: O1

void __thiscall
gl4cts::DirectStateAccess::Framebuffers::RenderbufferAttachmentTest::Clean
          (RenderbufferAttachmentTest *this)

{
  int iVar1;
  undefined4 extraout_var;
  long lVar2;
  
  iVar1 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar2 = CONCAT44(extraout_var,iVar1);
  if (this->m_fbo != 0) {
    (**(code **)(lVar2 + 0x440))(1,&this->m_fbo);
    this->m_fbo = 0;
  }
  if (this->m_rbo != 0) {
    (**(code **)(lVar2 + 0x460))(1,&this->m_rbo);
    this->m_rbo = 0;
  }
  do {
    iVar1 = (**(code **)(lVar2 + 0x800))();
  } while (iVar1 != 0);
  return;
}

Assistant:

void RenderbufferAttachmentTest::Clean()
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Cleanup. */
	if (m_fbo)
	{
		gl.deleteFramebuffers(1, &m_fbo);

		m_fbo = 0;
	}

	if (m_rbo)
	{
		gl.deleteRenderbuffers(1, &m_rbo);

		m_rbo = 0;
	}

	/* Errors clean up. */
	while (gl.getError())
		;
}